

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

bool __thiscall
QDockAreaLayout::insertGap(QDockAreaLayout *this,QList<int> *path,QLayoutItem *dockWidgetItem)

{
  int iVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<int> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(path->d).ptr;
  QList<int>::mid((QList<int> *)&QStack_38,path,1,-1);
  QDockAreaLayoutInfo::insertGap(this->docks + iVar1,(QList<int> *)&QStack_38,dockWidgetItem);
  QArrayDataPointer<int>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockAreaLayout::insertGap(const QList<int> &path, QLayoutItem *dockWidgetItem)
{
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    Q_ASSERT(index >= 0 && index < QInternal::DockCount);
    return docks[index].insertGap(path.mid(1), dockWidgetItem);
}